

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void parse_source(Context_conflict *ctx,char *filename,char *source,uint sourcelen,
                 MOJOSHADER_preprocessorDefine *defines,uint define_count,
                 MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close)

{
  ushort uVar1;
  yyParser *yypParser;
  Context_conflict *ctx_00;
  MOJOSHADER_free p_Var2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  SymbolMap *map;
  SymbolScope *pSVar6;
  ulong uVar7;
  bool bVar8;
  Preprocessor *_ctx;
  yyParser *yypParser_00;
  char *pcVar9;
  char *pcVar10;
  long *plVar11;
  ushort *puVar12;
  SymbolScope *pSVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  Token yyMajor;
  ulong uVar18;
  Context_conflict *ctx_1;
  yyParser *pParser;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Token tokenval;
  uint tokenlen;
  void *value;
  SymbolMap *local_50;
  SymbolMap *local_48;
  SymbolScope *local_40;
  uint *local_38;
  
  if (include_open == (MOJOSHADER_includeOpen)0x0) {
    include_open = MOJOSHADER_internal_include_open;
  }
  if (include_close == (MOJOSHADER_includeClose)0x0) {
    include_close = MOJOSHADER_internal_include_close;
  }
  _ctx = preprocessor_start(filename,source,sourcelen,include_open,include_close,defines,
                            define_count,0,MallocBridge,FreeBridge,ctx);
  if (_ctx == (Preprocessor *)0x0) {
    if (ctx->out_of_memory == 0) {
      __assert_fail("ctx->out_of_memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x113a,
                    "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                   );
    }
  }
  else {
    yypParser_00 = (yyParser *)(*ctx->malloc)(0x650,ctx->malloc_data);
    if (yypParser_00 == (yyParser *)0x0) {
      if (ctx->out_of_memory == 0) {
        __assert_fail("ctx->out_of_memory",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1141,
                      "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                     );
      }
      preprocessor_end(_ctx);
      return;
    }
    yypParser_00->yyidx = -1;
    init_builtins(ctx);
    local_50 = &ctx->usertypes;
    local_40 = (ctx->usertypes).scope;
    local_38 = &ctx->sourceline;
    local_48 = &ctx->variables;
    bVar5 = false;
    bVar4 = false;
    do {
      pcVar9 = preprocessor_nexttoken(_ctx,&tokenlen,&tokenval);
      if (ctx->out_of_memory != 0) break;
      pcVar10 = preprocessor_sourcepos(_ctx,local_38);
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = stringcache(ctx->strcache,pcVar10);
      }
      ctx->sourcefile = pcVar10;
      bVar8 = bVar5;
      if (tokenval - TOKEN_HASH < 2) {
        tokenval = TOKEN_BAD_CHARS;
LAB_001233d9:
        pcVar9 = "Bad characters in source file";
LAB_001233ea:
        failf(ctx,"%s",pcVar9);
        goto LAB_001233f1;
      }
      if (0x11e < (int)tokenval) {
        if (tokenval == TOKEN_PREPROCESSING_ERROR) goto LAB_001233ea;
        if (tokenval != TOKEN_PP_PRAGMA) goto LAB_00123441;
        bVar4 = true;
        bVar8 = true;
        if (bVar5) {
          __assert_fail("!is_pragma",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x116d,
                        "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                       );
        }
        goto LAB_001233f1;
      }
      if (tokenval == 10) {
        bVar4 = false;
        bVar8 = false;
        if (!bVar5) {
          __assert_fail("is_pragma",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1175,
                        "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                       );
        }
        goto LAB_001233f1;
      }
      if (tokenval == TOKEN_BAD_CHARS) goto LAB_001233d9;
LAB_00123441:
      if (bVar4) {
        bVar4 = true;
        goto LAB_001233f1;
      }
      if ((int)tokenval < 0x5e) {
        yyMajor = tokenval;
        switch(tokenval) {
        case 0x21:
        case 0x28:
        case 0x29:
          break;
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x27:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
switchD_001234a2_caseD_119:
          __assert_fail("0 && \"unexpected token from lexer\\n\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0xdd5,
                        "int convert_to_lemon_token(Context *, const char *, unsigned int, const Token)"
                       );
        case 0x25:
          yyMajor = 0x1f;
          break;
        case 0x26:
          yyMajor = 0x12;
          break;
        case 0x2a:
          yyMajor = 0x1d;
          break;
        case 0x2b:
          yyMajor = 0x1b;
          break;
        case 0x2c:
          yyMajor = 1;
          break;
        case 0x2d:
          yyMajor = 0x1c;
          break;
        case 0x2e:
          yyMajor = 0x25;
          break;
        case 0x2f:
          yyMajor = 0x1e;
          break;
        case 0x3a:
          yyMajor = 0x35;
          break;
        case 0x3b:
          yyMajor = 0x2b;
          break;
        case 0x3c:
          yyMajor = 0x15;
          break;
        case 0x3d:
          yyMajor = 2;
          break;
        case 0x3e:
          yyMajor = 0x17;
          break;
        case 0x3f:
          yyMajor = 0xd;
          break;
        default:
          if (tokenval == 0x5b) {
            yyMajor = 0x26;
          }
          else {
            if (tokenval != 0x5d) goto switchD_001234a2_caseD_119;
            yyMajor = 0x27;
          }
        }
        goto switchD_0012350c_caseD_21;
      }
      if (0x1c < tokenval - TOKEN_IDENTIFIER) {
        switch(tokenval) {
        case 0x7b:
          yyMajor = 0x41;
          break;
        case 0x7c:
          yyMajor = 0x10;
          break;
        case 0x7d:
          yyMajor = 0x42;
          break;
        case 0x7e:
          yyMajor = 0x22;
          break;
        default:
          if (tokenval != 0x5e) goto switchD_001234a2_caseD_119;
          yyMajor = 0x11;
        }
        goto switchD_0012350c_caseD_21;
      }
      uVar16 = (ulong)tokenlen;
      switch(tokenval) {
      case TOKEN_IDENTIFIER:
        switch(tokenlen) {
        case 2:
          if ((short)*(long *)pcVar9 == 0x6e69) {
            yyMajor = 0x31;
          }
          else if ((short)*(long *)pcVar9 == 0x6f64) {
            yyMajor = 0x65;
          }
          else {
            if ((short)*(long *)pcVar9 != 0x6669) goto switchD_001234be_caseD_e;
            yyMajor = 0x6c;
          }
          break;
        case 3:
          if (*(char *)((long)pcVar9 + 2) == 't' && (short)*(long *)pcVar9 == 0x756f) {
            yyMajor = 0x33;
          }
          else if (*(char *)((long)pcVar9 + 2) == 't' && (short)*(long *)pcVar9 == 0x6e69) {
            yyMajor = 0x50;
          }
          else if (*(char *)((long)pcVar9 + 2) == 'r' && (short)*(long *)pcVar9 == 0x6f66) {
            yyMajor = 0x6a;
          }
          else {
            if (*(char *)((long)pcVar9 + 2) != 's' || (short)*(long *)pcVar9 != 0x7078)
            goto switchD_001234be_caseD_e;
            yyMajor = 0x61;
          }
          break;
        case 4:
          if ((int)*(long *)pcVar9 == 0x65736c65) {
            yyMajor = 0x2a;
          }
          else if ((int)*(long *)pcVar9 == 0x64696f76) {
            yyMajor = 0x2f;
          }
          else {
            if ((int)*(long *)pcVar9 != 0x6c6f6f62) {
              if ((int)*(long *)pcVar9 == 0x746e6975) {
                yyMajor = 0x51;
              }
              else if ((int)*(long *)pcVar9 == 0x666c6168) {
                yyMajor = 0x52;
              }
              else if ((int)*(long *)pcVar9 == 0x706f6f6c) {
                yyMajor = 0x69;
              }
              else if ((int)*(long *)pcVar9 == 0x6c6c6163) {
                yyMajor = 0x74;
              }
              else {
                if ((int)*(long *)pcVar9 != 0x65736163) {
                  if ((int)*(long *)pcVar9 != 0x65757274) goto switchD_001234be_caseD_e;
                  yyMajor = 0x79;
                  break;
                }
                yyMajor = 0x75;
              }
              goto LAB_00124308;
            }
            yyMajor = 0x4f;
          }
          break;
        case 5:
          if (*(char *)((long)pcVar9 + 4) == 't' && (int)*(long *)pcVar9 == 0x756f6e69) {
            yyMajor = 0x32;
          }
          else if (*(char *)((long)pcVar9 + 4) == 't' && (int)*(long *)pcVar9 == 0x736e6f63) {
            yyMajor = 0x2d;
          }
          else {
            if (*(char *)((long)pcVar9 + 4) != 't' || (int)*(long *)pcVar9 != 0x616f6c66) {
              if (*(char *)((long)pcVar9 + 4) == 'm' && (int)*(long *)pcVar9 == 0x726f6e73) {
                yyMajor = 0x56;
              }
              else if (*(char *)((long)pcVar9 + 4) == 'm' && (int)*(long *)pcVar9 == 0x726f6e75) {
                yyMajor = 0x57;
              }
              else if (*(char *)((long)pcVar9 + 4) == 'k' && (int)*(long *)pcVar9 == 0x61657262) {
                yyMajor = 0x62;
              }
              else {
                if (*(char *)((long)pcVar9 + 4) != 'e' || (int)*(long *)pcVar9 != 0x6c696877) {
                  if (*(char *)((long)pcVar9 + 4) != 'e' || (int)*(long *)pcVar9 != 0x736c6166)
                  goto switchD_001234be_caseD_e;
                  yyMajor = 0x7a;
                  break;
                }
                yyMajor = 0x66;
              }
              goto LAB_00124308;
            }
            yyMajor = 0x53;
          }
          break;
        case 6:
          if (*(short *)((long)pcVar9 + 4) == 0x656e && (int)*(long *)pcVar9 == 0x696c6e69) {
            yyMajor = 0x30;
          }
          else if (*(short *)((long)pcVar9 + 4) == 0x7261 && (int)*(long *)pcVar9 == 0x656e696c) {
            yyMajor = 0x36;
          }
          else {
            if (*(short *)((long)pcVar9 + 4) != 0x656c || (int)*(long *)pcVar9 != 0x706d6173) {
              if (*(short *)((long)pcVar9 + 4) == 0x7463 && (int)*(long *)pcVar9 == 0x75727473) {
                yyMajor = 0x43;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x6e72 && (int)*(long *)pcVar9 == 0x65747865)
              {
                yyMajor = 0x3b;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x6465 && (int)*(long *)pcVar9 == 0x72616873)
              {
                yyMajor = 0x3c;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x6369 && (int)*(long *)pcVar9 == 0x74617473)
              {
                yyMajor = 0x3d;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x656c && (int)*(long *)pcVar9 == 0x62756f64)
              {
                yyMajor = 0x54;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x676e && (int)*(long *)pcVar9 == 0x69727473)
              {
                yyMajor = 0x55;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x7265 && (int)*(long *)pcVar9 == 0x66667562)
              {
                yyMajor = 0x58;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x726f && (int)*(long *)pcVar9 == 0x74636576)
              {
                yyMajor = 0x59;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x7869 && (int)*(long *)pcVar9 == 0x7274616d)
              {
                yyMajor = 0x5b;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x6e72 && (int)*(long *)pcVar9 == 0x75746572)
              {
                yyMajor = 0x67;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x6c6c && (int)*(long *)pcVar9 == 0x6f726e75)
              {
                yyMajor = 0x68;
              }
              else if (*(short *)((long)pcVar9 + 4) == 0x6863 && (int)*(long *)pcVar9 == 0x6e617262)
              {
                yyMajor = 0x6b;
              }
              else {
                if (*(short *)((long)pcVar9 + 4) != 0x6863 || (int)*(long *)pcVar9 != 0x74697773) {
                  if (*(short *)((long)pcVar9 + 4) != 0x6465 || (int)*(long *)pcVar9 != 0x73756e75)
                  goto switchD_001234be_caseD_e;
                  yyMajor = 0x60;
                  break;
                }
                yyMajor = 0x72;
              }
              goto LAB_00124308;
            }
            yyMajor = 0x3a;
          }
          break;
        case 7:
          if (*(int *)((long)pcVar9 + 3) == 0x6d726f66 && (int)*(long *)pcVar9 == 0x66696e75) {
            yyMajor = 0x34;
          }
          else if (*(int *)((long)pcVar9 + 3) == 0x66656465 && (int)*(long *)pcVar9 == 0x65707974) {
            yyMajor = 0x2c;
          }
          else {
            if (*(int *)((long)pcVar9 + 3) != 0x64726163 || (int)*(long *)pcVar9 != 0x63736964) {
              if (*(int *)((long)pcVar9 + 3) == 0x6e657474 && (int)*(long *)pcVar9 == 0x74616c66) {
                yyMajor = 0x6d;
              }
              else if (*(int *)((long)pcVar9 + 3) == 0x746c7561 &&
                       (int)*(long *)pcVar9 == 0x61666564) {
                yyMajor = 0x76;
              }
              else {
                if (*(int *)((long)pcVar9 + 3) != 0x72656c70 || (int)*(long *)pcVar9 != 0x706d6173)
                {
                  if (*(int *)((long)pcVar9 + 3) != 0x6574616c || (int)*(long *)pcVar9 != 0x6c6f7369
                     ) goto switchD_001234be_caseD_e;
                  yyMajor = 0x5c;
                  break;
                }
                yyMajor = 0x47;
              }
LAB_00124308:
              pcVar10 = (char *)0x0;
              goto LAB_0012406d;
            }
            yyMajor = 100;
          }
          break;
        case 8:
          if (*(long *)pcVar9 == 0x64696f72746e6563) {
            yyMajor = 0x37;
          }
          else if (*(long *)pcVar9 == 0x7265747369676572) {
            yyMajor = 0x45;
          }
          else if (*(long *)pcVar9 == 0x656c6974616c6f76) {
            yyMajor = 0x3e;
          }
          else {
            if (*(long *)pcVar9 != 0x65756e69746e6f63) goto switchD_001234be_caseD_e;
            yyMajor = 99;
          }
          break;
        case 9:
          if ((char)*(long *)((long)pcVar9 + 8) == 'r' && *(long *)pcVar9 == 0x6f6a616d5f776f72) {
            yyMajor = 0x3f;
          }
          else if ((char)*(long *)((long)pcVar9 + 8) == 'e' && *(long *)pcVar9 == 0x7361636563726f66
                  ) {
            yyMajor = 0x73;
          }
          else if ((char)*(long *)((long)pcVar9 + 8) == 'D' && *(long *)pcVar9 == 0x3172656c706d6173
                  ) {
            yyMajor = 0x48;
          }
          else {
            if ((char)*(long *)((long)pcVar9 + 8) == 'D' && *(long *)pcVar9 == 0x3272656c706d6173) {
              yyMajor = 0x49;
              goto LAB_00124308;
            }
            if ((char)*(long *)((long)pcVar9 + 8) != 'D' || *(long *)pcVar9 != 0x3372656c706d6173)
            goto switchD_001234be_caseD_e;
            yyMajor = 0x4a;
          }
          break;
        case 10:
          if ((short)*(long *)((long)pcVar9 + 8) != 0x7465 || *(long *)pcVar9 != 0x7366666f6b636170)
          goto switchD_001234be_caseD_e;
          yyMajor = 0x44;
          break;
        case 0xb:
          if (*(long *)((long)pcVar9 + 3) != 0x4542554372656c70 ||
              *(long *)pcVar9 != 0x4372656c706d6173) goto switchD_001234be_caseD_e;
          yyMajor = 0x4b;
          break;
        case 0xc:
          if ((int)*(long *)((long)pcVar9 + 8) == 0x726f6a61 &&
              *(long *)pcVar9 == 0x6d5f6e6d756c6f63) {
            yyMajor = 0x40;
          }
          else {
            if ((int)*(long *)((long)pcVar9 + 8) != 0x65746174 ||
                *(long *)pcVar9 != 0x5372656c706d6153) goto switchD_001234be_caseD_e;
            yyMajor = 0x4d;
          }
          break;
        case 0xd:
          if (*(long *)((long)pcVar9 + 5) == 0x6576697463657073 &&
              *(long *)pcVar9 == 0x6570737265706f6e) {
            yyMajor = 0x39;
          }
          else {
            if (*(long *)((long)pcVar9 + 5) != 0x65746174735f7265 ||
                *(long *)pcVar9 != 0x5f72656c706d6173) goto switchD_001234be_caseD_e;
            yyMajor = 0x4c;
          }
          break;
        default:
switchD_001234be_caseD_e:
          pcVar10 = stringcache_len(ctx->strcache,pcVar9,tokenlen);
          iVar17 = hash_find((ctx->usertypes).hash,pcVar10,&value);
          if (((iVar17 == 0) || (value == (void *)0x0)) || (*(long *)((long)value + 8) == 0)) {
            yyMajor = 0x2e;
            goto LAB_00123f91;
          }
          pcVar9 = stringcache_len(ctx->strcache,pcVar9,tokenlen);
          iVar17 = hash_find((ctx->usertypes).hash,pcVar9,&value);
          if ((iVar17 == 0) || (value == (void *)0x0)) {
LAB_0012446a:
            __assert_fail("data.datatype != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x118f,
                          "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                         );
          }
          pcVar10 = *(char **)((long)value + 8);
          yyMajor = 0x46;
          if (pcVar10 == (char *)0x0) goto LAB_0012446a;
          goto LAB_0012406d;
        case 0xf:
          if (*(long *)((long)pcVar9 + 7) != 0x6e6f6974616c6f70 ||
              *(long *)pcVar9 != 0x707265746e696f6e) goto switchD_001234be_caseD_e;
          yyMajor = 0x38;
          break;
        case 0x13:
          auVar22[0] = -(*(char *)((long)pcVar9 + 3) == 'I');
          auVar22[1] = -(*(char *)((long)pcVar9 + 4) == 'n');
          auVar22[2] = -(*(char *)((long)pcVar9 + 5) == 's');
          auVar22[3] = -(*(char *)((long)pcVar9 + 6) == 't');
          auVar22[4] = -(*(char *)((long)pcVar9 + 7) == 'r');
          auVar22[5] = -((char)*(long *)((long)pcVar9 + 8) == 'u');
          auVar22[6] = -(*(char *)((long)pcVar9 + 9) == 'c');
          auVar22[7] = -(*(char *)((long)pcVar9 + 10) == 't');
          auVar22[8] = -(*(char *)((long)pcVar9 + 0xb) == 'i');
          auVar22[9] = -(*(char *)((long)pcVar9 + 0xc) == 'o');
          auVar22[10] = -(*(char *)((long)pcVar9 + 0xd) == 'n');
          auVar22[0xb] = -(*(char *)((long)pcVar9 + 0xe) == 'C');
          auVar22[0xc] = -(*(char *)((long)pcVar9 + 0xf) == 'o');
          auVar22[0xd] = -((char)*(long *)((long)pcVar9 + 0x10) == 'u');
          auVar22[0xe] = -(*(char *)((long)pcVar9 + 0x11) == 'n');
          auVar22[0xf] = -(*(char *)((long)pcVar9 + 0x12) == 't');
          auVar19[0] = -((char)*(long *)pcVar9 == 'm');
          auVar19[1] = -(*(char *)((long)pcVar9 + 1) == 'a');
          auVar19[2] = -(*(char *)((long)pcVar9 + 2) == 'x');
          auVar19[3] = -(*(char *)((long)pcVar9 + 3) == 'I');
          auVar19[4] = -(*(char *)((long)pcVar9 + 4) == 'n');
          auVar19[5] = -(*(char *)((long)pcVar9 + 5) == 's');
          auVar19[6] = -(*(char *)((long)pcVar9 + 6) == 't');
          auVar19[7] = -(*(char *)((long)pcVar9 + 7) == 'r');
          auVar19[8] = -((char)*(long *)((long)pcVar9 + 8) == 'u');
          auVar19[9] = -(*(char *)((long)pcVar9 + 9) == 'c');
          auVar19[10] = -(*(char *)((long)pcVar9 + 10) == 't');
          auVar19[0xb] = -(*(char *)((long)pcVar9 + 0xb) == 'i');
          auVar19[0xc] = -(*(char *)((long)pcVar9 + 0xc) == 'o');
          auVar19[0xd] = -(*(char *)((long)pcVar9 + 0xd) == 'n');
          auVar19[0xe] = -(*(char *)((long)pcVar9 + 0xe) == 'C');
          auVar19[0xf] = -(*(char *)((long)pcVar9 + 0xf) == 'o');
          auVar19 = auVar19 & auVar22;
          if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff)
          goto switchD_001234be_caseD_e;
          yyMajor = 0x5d;
          break;
        case 0x16:
          auVar23[0] = -(*(char *)((long)pcVar9 + 6) == 'r');
          auVar23[1] = -(*(char *)((long)pcVar9 + 7) == 'C');
          auVar23[2] = -((char)*(long *)((long)pcVar9 + 8) == 'o');
          auVar23[3] = -(*(char *)((long)pcVar9 + 9) == 'm');
          auVar23[4] = -(*(char *)((long)pcVar9 + 10) == 'p');
          auVar23[5] = -(*(char *)((long)pcVar9 + 0xb) == 'a');
          auVar23[6] = -(*(char *)((long)pcVar9 + 0xc) == 'r');
          auVar23[7] = -(*(char *)((long)pcVar9 + 0xd) == 'i');
          auVar23[8] = -(*(char *)((long)pcVar9 + 0xe) == 's');
          auVar23[9] = -(*(char *)((long)pcVar9 + 0xf) == 'o');
          auVar23[10] = -((char)*(long *)((long)pcVar9 + 0x10) == 'n');
          auVar23[0xb] = -(*(char *)((long)pcVar9 + 0x11) == 'S');
          auVar23[0xc] = -(*(char *)((long)pcVar9 + 0x12) == 't');
          auVar23[0xd] = -(*(char *)((long)pcVar9 + 0x13) == 'a');
          auVar23[0xe] = -(*(char *)((long)pcVar9 + 0x14) == 't');
          auVar23[0xf] = -(*(char *)((long)pcVar9 + 0x15) == 'e');
          auVar20[0] = -((char)*(long *)pcVar9 == 'S');
          auVar20[1] = -(*(char *)((long)pcVar9 + 1) == 'a');
          auVar20[2] = -(*(char *)((long)pcVar9 + 2) == 'm');
          auVar20[3] = -(*(char *)((long)pcVar9 + 3) == 'p');
          auVar20[4] = -(*(char *)((long)pcVar9 + 4) == 'l');
          auVar20[5] = -(*(char *)((long)pcVar9 + 5) == 'e');
          auVar20[6] = -(*(char *)((long)pcVar9 + 6) == 'r');
          auVar20[7] = -(*(char *)((long)pcVar9 + 7) == 'C');
          auVar20[8] = -((char)*(long *)((long)pcVar9 + 8) == 'o');
          auVar20[9] = -(*(char *)((long)pcVar9 + 9) == 'm');
          auVar20[10] = -(*(char *)((long)pcVar9 + 10) == 'p');
          auVar20[0xb] = -(*(char *)((long)pcVar9 + 0xb) == 'a');
          auVar20[0xc] = -(*(char *)((long)pcVar9 + 0xc) == 'r');
          auVar20[0xd] = -(*(char *)((long)pcVar9 + 0xd) == 'i');
          auVar20[0xe] = -(*(char *)((long)pcVar9 + 0xe) == 's');
          auVar20[0xf] = -(*(char *)((long)pcVar9 + 0xf) == 'o');
          auVar20 = auVar20 & auVar23;
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff)
          goto switchD_001234be_caseD_e;
          yyMajor = 0x4e;
          break;
        case 0x19:
          auVar24[0] = -(*(char *)((long)pcVar9 + 9) == 'i');
          auVar24[1] = -(*(char *)((long)pcVar9 + 10) == 'o');
          auVar24[2] = -(*(char *)((long)pcVar9 + 0xb) == 'n');
          auVar24[3] = -(*(char *)((long)pcVar9 + 0xc) == 'O');
          auVar24[4] = -(*(char *)((long)pcVar9 + 0xd) == 'p');
          auVar24[5] = -(*(char *)((long)pcVar9 + 0xe) == 't');
          auVar24[6] = -(*(char *)((long)pcVar9 + 0xf) == 'i');
          auVar24[7] = -((char)*(long *)((long)pcVar9 + 0x10) == 'm');
          auVar24[8] = -(*(char *)((long)pcVar9 + 0x11) == 'i');
          auVar24[9] = -(*(char *)((long)pcVar9 + 0x12) == 'z');
          auVar24[10] = -(*(char *)((long)pcVar9 + 0x13) == 'a');
          auVar24[0xb] = -(*(char *)((long)pcVar9 + 0x14) == 't');
          auVar24[0xc] = -(*(char *)((long)pcVar9 + 0x15) == 'i');
          auVar24[0xd] = -(*(char *)((long)pcVar9 + 0x16) == 'o');
          auVar24[0xe] = -(*(char *)((long)pcVar9 + 0x17) == 'n');
          auVar24[0xf] = -((char)*(long *)((long)pcVar9 + 0x18) == 's');
          auVar21[0] = -((char)*(long *)pcVar9 == 'n');
          auVar21[1] = -(*(char *)((long)pcVar9 + 1) == 'o');
          auVar21[2] = -(*(char *)((long)pcVar9 + 2) == 'E');
          auVar21[3] = -(*(char *)((long)pcVar9 + 3) == 'x');
          auVar21[4] = -(*(char *)((long)pcVar9 + 4) == 'p');
          auVar21[5] = -(*(char *)((long)pcVar9 + 5) == 'r');
          auVar21[6] = -(*(char *)((long)pcVar9 + 6) == 'e');
          auVar21[7] = -(*(char *)((long)pcVar9 + 7) == 's');
          auVar21[8] = -((char)*(long *)((long)pcVar9 + 8) == 's');
          auVar21[9] = -(*(char *)((long)pcVar9 + 9) == 'i');
          auVar21[10] = -(*(char *)((long)pcVar9 + 10) == 'o');
          auVar21[0xb] = -(*(char *)((long)pcVar9 + 0xb) == 'n');
          auVar21[0xc] = -(*(char *)((long)pcVar9 + 0xc) == 'O');
          auVar21[0xd] = -(*(char *)((long)pcVar9 + 0xd) == 'p');
          auVar21[0xe] = -(*(char *)((long)pcVar9 + 0xe) == 't');
          auVar21[0xf] = -(*(char *)((long)pcVar9 + 0xf) == 'i');
          auVar21 = auVar21 & auVar24;
          if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff)
          goto switchD_001234be_caseD_e;
          yyMajor = 0x5e;
        }
        break;
      case TOKEN_INT_LITERAL:
        lVar15 = 1;
        if (tokenlen == 0) {
          uVar16 = 0;
        }
        else {
          plVar11 = (long *)((long)pcVar9 + uVar16);
          do {
            if ((char)*(long *)pcVar9 != ' ') {
              if ((char)*(long *)pcVar9 == '-') {
                pcVar9 = (char *)((long)pcVar9 + 1);
                uVar16 = (ulong)((int)uVar16 - 1);
                lVar15 = -1;
              }
              goto LAB_00123750;
            }
            pcVar9 = (char *)((long)pcVar9 + 1);
            uVar14 = (int)uVar16 - 1;
            uVar16 = (ulong)uVar14;
          } while (uVar14 != 0);
          uVar16 = 0;
          pcVar9 = (char *)plVar11;
        }
LAB_00123750:
        uVar14 = (uint)uVar16;
        uVar7 = 0;
        do {
          uVar18 = uVar7;
          if (uVar16 == uVar18) goto LAB_00123770;
          uVar7 = uVar18 + 1;
        } while (0xf5 < (byte)(*(char *)((long)pcVar9 + uVar18) - 0x3aU));
        uVar14 = (uint)uVar18;
LAB_00123770:
        yyMajor = 0x5a;
        if (uVar14 == 0) break;
        iVar17 = uVar14 + 1;
        pcVar9 = (char *)((ulong)uVar14 + (long)pcVar9);
        pcVar10 = (char *)0x0;
        do {
          pcVar9 = pcVar9 + -1;
          pcVar10 = pcVar10 + ((long)*pcVar9 + -0x30) * lVar15;
          lVar15 = lVar15 * 10;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
        goto LAB_0012406d;
      case TOKEN_FLOAT_LITERAL:
        pcVar10 = (char *)strtodouble(pcVar9,tokenlen);
        yyMajor = 0x77;
        goto LAB_0012406d;
      case TOKEN_STRING_LITERAL:
        yyMajor = 0x78;
LAB_00123f91:
        pcVar10 = stringcache_len(ctx->strcache,pcVar9,tokenlen);
        goto LAB_0012406d;
      case TOKEN_RSHIFTASSIGN:
        yyMajor = 9;
        break;
      case TOKEN_LSHIFTASSIGN:
        yyMajor = 8;
        break;
      case TOKEN_ADDASSIGN:
        yyMajor = 3;
        break;
      case TOKEN_SUBASSIGN:
        yyMajor = 4;
        break;
      case TOKEN_MULTASSIGN:
        yyMajor = 5;
        break;
      case TOKEN_DIVASSIGN:
        yyMajor = 6;
        break;
      case TOKEN_MODASSIGN:
        yyMajor = 7;
        break;
      case TOKEN_XORASSIGN:
        yyMajor = 0xc;
        break;
      case TOKEN_ANDASSIGN:
        yyMajor = 10;
        break;
      case TOKEN_ORASSIGN:
        yyMajor = 0xb;
        break;
      case TOKEN_INCREMENT:
        yyMajor = 0x24;
        break;
      case TOKEN_DECREMENT:
        yyMajor = 0x23;
        break;
      case TOKEN_RSHIFT:
        yyMajor = 0x1a;
        break;
      case TOKEN_LSHIFT:
        yyMajor = 0x19;
        break;
      case TOKEN_ANDAND:
        yyMajor = 0xf;
        break;
      case TOKEN_OROR:
        yyMajor = 0xe;
        break;
      case TOKEN_LEQ:
        yyMajor = 0x16;
        break;
      case TOKEN_GEQ:
        yyMajor = 0x18;
        break;
      case TOKEN_EQL:
        yyMajor = 0x13;
        break;
      case TOKEN_NEQ:
        yyMajor = 0x14;
        break;
      default:
        goto switchD_001234a2_caseD_119;
      case TOKEN_EOI:
        yyMajor = 0;
      }
switchD_0012350c_caseD_21:
      pcVar10 = (char *)0x0;
LAB_0012406d:
      uVar16 = (ulong)(uint)yypParser_00->yyidx;
      if (yypParser_00->yyidx < 0) {
        yypParser_00->yyidx = 0;
        yypParser_00->yyerrcnt = -1;
        yypParser_00->yystack[0].stateno = 0;
        yypParser_00->yystack[0].major = '\0';
        uVar16 = 0;
      }
      yypParser_00->ctx = ctx;
      value = pcVar10;
      do {
        uVar16 = (ulong)yypParser_00->yystack[uVar16].stateno;
        if (((uVar16 < 0x129) && (uVar14 = (int)yy_shift_ofst[uVar16] + yyMajor, uVar14 < 0x151f))
           && (yy_lookahead[uVar14] == (uchar)yyMajor)) {
          puVar12 = yy_action + uVar14;
        }
        else {
          puVar12 = yy_default + uVar16;
        }
        uVar1 = *puVar12;
        if (uVar1 < 0x20d) {
          if (yyMajor == 0) {
            __assert_fail("!yyendofinput",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                          ,0x1046,"void ParseHLSL(void *, int, TokenData, Context *)");
          }
          yy_shift(yypParser_00,(uint)uVar1,yyMajor,(YYMINORTYPE *)&value);
          yypParser_00->yyerrcnt = yypParser_00->yyerrcnt + -1;
          break;
        }
        uVar14 = (uint)uVar1;
        if (0x32c < uVar14) {
          if (uVar14 != 0x32d) {
            __assert_fail("yyact == YY_ERROR_ACTION",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                          ,0x104d,"void ParseHLSL(void *, int, TokenData, Context *)");
          }
          yypParser = (yyParser *)yypParser_00->ctx;
          if (yypParser_00->yyerrcnt < 1) {
            failf((Context_conflict *)yypParser,"%s","Syntax error");
            yypParser_00->ctx = (Context_conflict *)yypParser;
          }
          yypParser_00->yyerrcnt = 3;
          yy_destructor(yypParser,(uchar)yyMajor,(YYMINORTYPE *)&value);
          if (yyMajor == 0) {
            ctx_00 = yypParser_00->ctx;
            while (-1 < yypParser_00->yyidx) {
              yy_pop_parser_stack(yypParser_00);
            }
            failf(ctx_00,"%s","Giving up. Parser is hopelessly lost...");
            yypParser_00->ctx = ctx_00;
          }
          break;
        }
        yy_reduce(yypParser_00,uVar14 - 0x20d);
        uVar16 = (ulong)(uint)yypParser_00->yyidx;
      } while (-1 < yypParser_00->yyidx);
      bVar4 = false;
      if (yyMajor == 0x42) {
        pop_symbol_scope(ctx,local_50);
        pop_symbol_scope(ctx,local_48);
      }
      else if (yyMajor == 0x41) {
        push_usertype(ctx,(char *)0x0,(MOJOSHADER_astDataType *)0x0);
        bVar4 = false;
        if (ctx->out_of_memory == 0) {
          pSVar13 = (SymbolScope *)(*ctx->malloc)(0x20,ctx->malloc_data);
          if (pSVar13 == (SymbolScope *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
            bVar4 = false;
          }
          else {
            pSVar13->symbol = (char *)0x0;
            pSVar13->datatype = (MOJOSHADER_astDataType *)0x0;
            pSVar13->index = 0;
            pSVar13->referenced = 0;
            pSVar13->next = (ctx->variables).scope;
            (ctx->variables).scope = pSVar13;
          }
        }
      }
LAB_001233f1:
      bVar5 = bVar8;
    } while (tokenval != TOKEN_EOI);
    pSVar6 = local_40;
    map = local_50;
    pSVar13 = (ctx->usertypes).scope;
    while (pSVar13 != pSVar6) {
      pop_symbol(ctx,map);
      pSVar13 = (ctx->usertypes).scope;
    }
    p_Var2 = ctx->free;
    pvVar3 = ctx->malloc_data;
    while (-1 < yypParser_00->yyidx) {
      yy_pop_parser_stack(yypParser_00);
    }
    (*p_Var2)(yypParser_00,pvVar3);
    preprocessor_end(_ctx);
  }
  return;
}

Assistant:

static void parse_source(Context *ctx, const char *filename,
                         const char *source, unsigned int sourcelen,
                         const MOJOSHADER_preprocessorDefine *defines,
                         unsigned int define_count,
                         MOJOSHADER_includeOpen include_open,
                         MOJOSHADER_includeClose include_close)
{
    TokenData data;
    unsigned int tokenlen;
    Token tokenval;
    const char *token;
    int lemon_token;
    const char *fname;
    Preprocessor *pp;
    void *parser;

    if (!include_open) include_open = MOJOSHADER_internal_include_open;
    if (!include_close) include_close = MOJOSHADER_internal_include_close;

    pp = preprocessor_start(filename, source, sourcelen, include_open,
                            include_close, defines, define_count, 0,
                            MallocBridge, FreeBridge, ctx);
    if (pp == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        return;
    } // if

    parser = ParseHLSLAlloc(ctx->malloc, ctx->malloc_data);
    if (parser == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        preprocessor_end(pp);
        return;
    } // if

    // !!! FIXME: check if (parser == NULL)...

    init_builtins(ctx);

    SymbolScope *start_scope = ctx->usertypes.scope;

    #if DEBUG_COMPILER_PARSER
    ParseHLSLTrace(stdout, "COMPILER: ");
    #endif

    // Run the preprocessor/lexer/parser...
    int is_pragma = 0;   // !!! FIXME: remove this later when we can parse #pragma.
    int skipping = 0; // !!! FIXME: remove this later when we can parse #pragma.
    do {
        token = preprocessor_nexttoken(pp, &tokenlen, &tokenval);

        if (ctx->out_of_memory)
            break;

        fname = preprocessor_sourcepos(pp, &ctx->sourceline);
        ctx->sourcefile = fname ? stringcache(ctx->strcache, fname) : 0;

        if ((tokenval == TOKEN_HASH) || (tokenval == TOKEN_HASHHASH))
            tokenval = TOKEN_BAD_CHARS;

        if (tokenval == TOKEN_BAD_CHARS)
        {
            fail(ctx, "Bad characters in source file");
            continue;
        } // else if

        else if (tokenval == TOKEN_PREPROCESSING_ERROR)
        {
            fail(ctx, token);  // this happens to be null-terminated.
            continue;
        } // else if

        else if (tokenval == TOKEN_PP_PRAGMA)
        {
            assert(!is_pragma);
            is_pragma = 1;
            skipping = 1;
            continue;
        }

        else if (tokenval == ((Token) '\n'))
        {
            assert(is_pragma);
            is_pragma = 0;
            skipping = 0;
            continue;
        }

        else if (skipping)
        {
            continue;
        }

        // !!! FIXME: this is a mess, decide who should be doing this stuff, and only do it once.
        lemon_token = convert_to_lemon_token(ctx, token, tokenlen, tokenval);
        switch (lemon_token)
        {
            case TOKEN_HLSL_INT_CONSTANT:
                data.i64 = strtoi64(token, tokenlen);
                break;

            case TOKEN_HLSL_FLOAT_CONSTANT:
                data.dbl = strtodouble(token, tokenlen);
                break;

            case TOKEN_HLSL_USERTYPE:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                data.datatype = get_usertype(ctx, data.string);  // !!! FIXME: do we need this? It's kind of useless during parsing.
                assert(data.datatype != NULL);
                break;

            case TOKEN_HLSL_STRING_LITERAL:
            case TOKEN_HLSL_IDENTIFIER:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                break;

            default:
                data.i64 = 0;
                break;
        } // switch

        ParseHLSL(parser, lemon_token, data, ctx);

        // this probably isn't perfect, but it's good enough for surviving
        //  the parse. We'll sort out correctness once we have a tree.
        if (lemon_token == TOKEN_HLSL_LBRACE)
            push_scope(ctx);
        else if (lemon_token == TOKEN_HLSL_RBRACE)
            pop_scope(ctx);
    } while (tokenval != TOKEN_EOI);

    // Clean out extra usertypes; they are dummies until semantic analysis.
    while (ctx->usertypes.scope != start_scope)
        pop_symbol(ctx, &ctx->usertypes);

    ParseHLSLFree(parser, ctx->free, ctx->malloc_data);
    preprocessor_end(pp);
}